

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

int64_t __thiscall
icu_63::number::impl::DecimalQuantity::toLong(DecimalQuantity *this,bool truncateIfOverflow)

{
  ulong uVar1;
  int8_t *piVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  undefined7 in_register_00000031;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  lVar9 = (long)this->scale;
  iVar6 = this->precision + this->scale;
  if (this->lOptPos < iVar6) {
    iVar6 = this->lOptPos;
  }
  uVar7 = iVar6 - 1;
  uVar4 = 0x11;
  if ((int)uVar7 < 0x11) {
    uVar4 = uVar7;
  }
  if ((int)CONCAT71(in_register_00000031,truncateIfOverflow) == 0) {
    uVar4 = uVar7;
  }
  if ((int)uVar4 < 0) {
    lVar10 = 0;
  }
  else {
    piVar2 = (this->fBCD).bcdBytes.ptr;
    lVar5 = (ulong)uVar4 * 4 + lVar9 * -4;
    lVar10 = 0;
    uVar11 = (ulong)uVar4;
    do {
      uVar1 = uVar11 - lVar9;
      if (this->usingBytes == false) {
        if (0xf < uVar1) goto LAB_00216228;
        bVar8 = (byte)((ulong)piVar2 >> ((byte)lVar5 & 0x3f)) & 0xf;
      }
      else if ((long)uVar1 < (long)this->precision && -1 < (long)uVar1) {
        bVar8 = piVar2[uVar11 - lVar9];
      }
      else {
LAB_00216228:
        bVar8 = 0;
      }
      lVar10 = (long)(char)bVar8 + lVar10 * 10;
      lVar5 = lVar5 + -4;
      bVar3 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar3);
  }
  lVar9 = -lVar10;
  if ((this->flags & 1U) == 0) {
    lVar9 = lVar10;
  }
  return lVar9;
}

Assistant:

int64_t DecimalQuantity::toLong(bool truncateIfOverflow) const {
    // NOTE: Call sites should be guarded by fitsInLong(), like this:
    // if (dq.fitsInLong()) { /* use dq.toLong() */ } else { /* use some fallback */ }
    // Fallback behavior upon truncateIfOverflow is to truncate at 17 digits.
    uint64_t result = 0L;
    int32_t upperMagnitude = std::min(scale + precision, lOptPos) - 1;
    if (truncateIfOverflow) {
        upperMagnitude = std::min(upperMagnitude, 17);
    }
    for (int32_t magnitude = upperMagnitude; magnitude >= 0; magnitude--) {
        result = result * 10 + getDigitPos(magnitude - scale);
    }
    if (isNegative()) {
        return static_cast<int64_t>(0LL - result); // i.e., -result
    }
    return static_cast<int64_t>(result);
}